

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::NamedParamAssignmentSyntax::getChildPtr
          (NamedParamAssignmentSyntax *this,size_t index)

{
  undefined8 in_RSI;
  PtrTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffc8;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
    break;
  case 2:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 4:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax NamedParamAssignmentSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &dot;
        case 1: return &name;
        case 2: return &openParen;
        case 3: return expr;
        case 4: return &closeParen;
        default: return nullptr;
    }
}